

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

int __thiscall PClass::FindVirtualIndex(PClass *this,FName *name,PPrototype *proto)

{
  uint uVar1;
  uint uVar2;
  VMFunction *pVVar3;
  PPrototype *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = (ulong)(this->Virtuals).Count;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pVVar3 = (this->Virtuals).Array[uVar6];
      if ((pVVar3->Name).Index == name->Index) {
        pPVar4 = pVVar3->Proto;
        uVar1 = (pPVar4->ReturnTypes).Count;
        if (uVar1 == (proto->ReturnTypes).Count) {
          uVar2 = (pPVar4->ArgumentTypes).Count;
          if (uVar2 == (proto->ArgumentTypes).Count) {
            if (1 < uVar2) {
              uVar7 = 1;
              do {
                if ((proto->ArgumentTypes).Array[uVar7] != (pPVar4->ArgumentTypes).Array[uVar7])
                goto LAB_0037fea4;
                uVar7 = uVar7 + 1;
              } while (uVar2 != uVar7);
            }
            if ((ulong)uVar1 == 0) {
LAB_0037feb2:
              return (int)uVar6;
            }
            uVar7 = 0;
            while ((proto->ReturnTypes).Array[uVar7] == (pPVar4->ReturnTypes).Array[uVar7]) {
              uVar7 = uVar7 + 1;
              if (uVar1 == uVar7) goto LAB_0037feb2;
            }
          }
        }
      }
LAB_0037fea4:
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return -1;
}

Assistant:

int PClass::FindVirtualIndex(FName name, PPrototype *proto)
{
	for (unsigned i = 0; i < Virtuals.Size(); i++)
	{
		if (Virtuals[i]->Name == name)
		{
			auto vproto = Virtuals[i]->Proto;
			if (vproto->ReturnTypes.Size() != proto->ReturnTypes.Size() ||
				vproto->ArgumentTypes.Size() != proto->ArgumentTypes.Size())
			{
				continue;	// number of parameters does not match, so it's incompatible
			}
			bool fail = false;
			// The first argument is self and will mismatch so just skip it.
			for (unsigned a = 1; a < proto->ArgumentTypes.Size(); a++)
			{
				if (proto->ArgumentTypes[a] != vproto->ArgumentTypes[a])
				{
					fail = true;
					break;
				}
			}
			if (fail) continue;

			for (unsigned a = 0; a < proto->ReturnTypes.Size(); a++)
			{
				if (proto->ReturnTypes[a] != vproto->ReturnTypes[a])
				{
					fail = true;
					break;
				}
			}
			if (!fail) return i;
		}
	}
	return -1;
}